

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.h
# Opt level: O2

void __thiscall CVmObjVector::set_undo_bit(CVmObjVector *this,size_t idx,int val)

{
  byte bVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  
  puVar2 = (ushort *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  bVar1 = *(byte *)((long)puVar2 + (idx >> 3) + 4 + (ulong)*puVar2 * 5);
  bVar3 = (byte)idx & 7;
  bVar4 = '\x01' << ((byte)idx & 7) | bVar1;
  if (val == 0) {
    bVar4 = (-2 << bVar3 | 0xfeU >> 8 - bVar3) & bVar1;
  }
  *(byte *)((long)puVar2 + (idx >> 3) + 4 + (ulong)*puVar2 * 5) = bVar4;
  return;
}

Assistant:

char *cons_get_vector_ext_ptr() const { return ext_; }